

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          BaseTextGenerator *generator)

{
  bool bVar1;
  uint uVar2;
  FastFieldValuePrinter *pFVar3;
  Message *message_00;
  uint64_t uVar4;
  string *psVar5;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar6;
  _func_int *UNRECOVERED_JUMPTABLE;
  string *psVar7;
  AlphaNum *a;
  FieldDescriptor *message_01;
  ulong uVar8;
  long lStack_d0;
  string truncated_value;
  string scratch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = FieldDescriptor::is_repeated(field);
  if (index != -1 && !bVar1) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&scratch,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/text_format.cc"
               ,0xaba,0x25,"field->is_repeated() || (index == -1)");
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)&scratch,(char (*) [41])"Index must be -1 for non-repeated fields");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&scratch)
    ;
  }
  message_01 = field;
  pFVar3 = GetFieldPrinter(this,field);
  bVar1 = TryRedactFieldValue(this,(Message *)message_01,field,generator,false);
  if (bVar1) {
    return;
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      uVar2 = Reflection::GetRepeatedInt32(reflection,message,field,index);
    }
    else {
      uVar2 = Reflection::GetInt32(reflection,message,field);
    }
    UNRECOVERED_JUMPTABLE = pFVar3->_vptr_FastFieldValuePrinter[3];
    break;
  case 2:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      uVar4 = Reflection::GetRepeatedInt64(reflection,message,field,index);
    }
    else {
      uVar4 = Reflection::GetInt64(reflection,message,field);
    }
    UNRECOVERED_JUMPTABLE = pFVar3->_vptr_FastFieldValuePrinter[5];
    goto LAB_002c6255;
  case 3:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      uVar2 = Reflection::GetRepeatedUInt32(reflection,message,field,index);
    }
    else {
      uVar2 = Reflection::GetUInt32(reflection,message,field);
    }
    UNRECOVERED_JUMPTABLE = pFVar3->_vptr_FastFieldValuePrinter[4];
    break;
  case 4:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      uVar4 = Reflection::GetRepeatedUInt64(reflection,message,field,index);
    }
    else {
      uVar4 = Reflection::GetUInt64(reflection,message,field);
    }
    UNRECOVERED_JUMPTABLE = pFVar3->_vptr_FastFieldValuePrinter[6];
LAB_002c6255:
    (*UNRECOVERED_JUMPTABLE)(pFVar3,uVar4,generator,UNRECOVERED_JUMPTABLE);
    return;
  case 5:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      Reflection::GetRepeatedDouble(reflection,message,field,index);
    }
    else {
      Reflection::GetDouble(reflection,message,field);
    }
    UNRECOVERED_JUMPTABLE = pFVar3->_vptr_FastFieldValuePrinter[8];
    goto LAB_002c627e;
  case 6:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      Reflection::GetRepeatedFloat(reflection,message,field,index);
    }
    else {
      Reflection::GetFloat(reflection,message,field);
    }
    UNRECOVERED_JUMPTABLE = pFVar3->_vptr_FastFieldValuePrinter[7];
LAB_002c627e:
    (*UNRECOVERED_JUMPTABLE)(pFVar3,generator);
    return;
  case 7:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      bVar1 = Reflection::GetRepeatedBool(reflection,message,field,index);
    }
    else {
      bVar1 = Reflection::GetBool(reflection,message,field);
    }
    UNRECOVERED_JUMPTABLE = pFVar3->_vptr_FastFieldValuePrinter[2];
    uVar8 = (ulong)bVar1;
    goto LAB_002c62a7;
  case 8:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      uVar2 = Reflection::GetRepeatedEnumValue(reflection,message,field,index);
    }
    else {
      uVar2 = Reflection::GetEnumValue(reflection,message,field);
    }
    this_00 = FieldDescriptor::enum_type(field);
    pEVar6 = EnumDescriptor::FindValueByNumber(this_00,uVar2);
    if (pEVar6 != (EnumValueDescriptor *)0x0) {
      (*pFVar3->_vptr_FastFieldValuePrinter[0xb])(pFVar3,(ulong)uVar2,pEVar6->all_names_,generator);
      return;
    }
    absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)&scratch,uVar2);
    absl::lts_20240722::StrCat_abi_cxx11_(&truncated_value,(lts_20240722 *)&scratch,a);
    (*pFVar3->_vptr_FastFieldValuePrinter[0xb])(pFVar3,(ulong)uVar2,&truncated_value,generator);
    psVar5 = &truncated_value;
    goto LAB_002c63cf;
  case 9:
    scratch._M_dataplus._M_p = (pointer)&scratch.field_2;
    scratch._M_string_length = 0;
    scratch.field_2._M_local_buf[0] = '\0';
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      psVar5 = Reflection::GetRepeatedStringReference(reflection,message,field,index,&scratch);
    }
    else {
      psVar5 = Reflection::GetStringReference(reflection,message,field,&scratch);
    }
    truncated_value._M_dataplus._M_p = (pointer)&truncated_value.field_2;
    truncated_value._M_string_length = 0;
    truncated_value.field_2._M_local_buf[0] = '\0';
    if ((0 < this->truncate_string_field_longer_than_) &&
       ((ulong)this->truncate_string_field_longer_than_ < psVar5->_M_string_length)) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)psVar5);
      psVar5 = &truncated_value;
      std::operator+(&local_50,&local_70,"...<truncated>...");
      std::__cxx11::string::operator=((string *)psVar5,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    if (field->type_ == 9) {
      lStack_d0 = 0x48;
    }
    else {
      local_70._M_dataplus._M_p._0_4_ = 0xc;
      local_50._M_dataplus._M_p._0_4_ = (uint)field->type_;
      psVar7 = absl::lts_20240722::log_internal::
               Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::Type,google::protobuf::internal::FieldDescriptorLite::Type>
                         ((Type *)&local_50,(Type *)&local_70,
                          "field->type() == FieldDescriptor::TYPE_BYTES");
      if (psVar7 != (string *)0x0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/text_format.cc"
                   ,0xae9,psVar7->_M_string_length,(psVar7->_M_dataplus)._M_p);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_50);
      }
      lStack_d0 = 0x50;
    }
    (**(code **)((long)pFVar3->_vptr_FastFieldValuePrinter + lStack_d0))(pFVar3,psVar5,generator);
    std::__cxx11::string::~string((string *)&truncated_value);
    psVar5 = &scratch;
LAB_002c63cf:
    std::__cxx11::string::~string((string *)psVar5);
switchD_002c5fff_default:
    return;
  case 10:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      message_00 = Reflection::GetRepeatedMessage(reflection,message,field,index);
    }
    else {
      message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
    }
    Print(this,message_00,generator);
    return;
  default:
    goto switchD_002c5fff_default;
  }
  uVar8 = (ulong)uVar2;
LAB_002c62a7:
  (*UNRECOVERED_JUMPTABLE)(pFVar3,uVar8,generator,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValue(const Message& message,
                                          const Reflection* reflection,
                                          const FieldDescriptor* field,
                                          int index,
                                          BaseTextGenerator* generator) const {
  ABSL_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);
  if (TryRedactFieldValue(message, field, generator,
                          /*insert_value_separator=*/false)) {
    return;
  }

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                           \
    printer->Print##METHOD(                                          \
        field->is_repeated()                                         \
            ? reflection->GetRepeated##METHOD(message, field, index) \
            : reflection->Get##METHOD(message, field),               \
        generator);                                                  \
    break

    OUTPUT_FIELD(INT32, Int32);
    OUTPUT_FIELD(INT64, Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD(FLOAT, Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(BOOL, Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      std::string scratch;
      const std::string& value =
          field->is_repeated()
              ? reflection->GetRepeatedStringReference(message, field, index,
                                                       &scratch)
              : reflection->GetStringReference(message, field, &scratch);
      const std::string* value_to_print = &value;
      std::string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          static_cast<size_t>(truncate_string_field_longer_than_) <
              value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        printer->PrintString(*value_to_print, generator);
      } else {
        ABSL_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        printer->PrintBytes(*value_to_print, generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value =
          field->is_repeated()
              ? reflection->GetRepeatedEnumValue(message, field, index)
              : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != nullptr) {
        printer->PrintEnum(enum_value, internal::NameOfEnumAsString(enum_desc),
                           generator);
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        printer->PrintEnum(enum_value, absl::StrCat(enum_value), generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
                ? reflection->GetRepeatedMessage(message, field, index)
                : reflection->GetMessage(message, field),
            generator);
      break;
  }
}